

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O0

void __thiscall Pose::setrot(Pose *this,double RX,double RY,double RZ)

{
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_98;
  double local_78;
  double sr;
  double cr;
  double sp;
  double cp;
  double sy;
  double cy;
  double w;
  double z;
  double y;
  double x;
  double RZ_local;
  double RY_local;
  double RX_local;
  Pose *this_local;
  
  x = RZ;
  RZ_local = RY;
  RY_local = RX;
  RX_local = (double)this;
  sy = cos(RZ * 0.5);
  cp = sin(x * 0.5);
  sp = cos(RZ_local * 0.5);
  cr = sin(RZ_local * 0.5);
  sr = cos(RY_local * 0.5);
  local_78 = sin(RY_local * 0.5);
  y = local_78 * sp * sy - sr * cr * cp;
  z = sr * cr * sy + local_78 * sp * cp;
  w = sr * sp * cp - local_78 * cr * sy;
  cy = sr * sp * sy + local_78 * cr * cp;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (&local_98,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&this->rot,&y);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(&local_98,&z);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar1,&w);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar1,&cy);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_98);
  return;
}

Assistant:

void Pose::setrot(double RX, double RY, double RZ){
      double x, y, z, w;
      // Abbreviations for the various angular functions
      double cy = cos(RZ * 0.5);
      double sy = sin(RZ * 0.5);
      double cp = cos(RY * 0.5);
      double sp = sin(RY * 0.5);
      double cr = cos(RX * 0.5);
      double sr = sin(RX * 0.5);

      x = sr * cp * cy - cr * sp * sy;
      y = cr * sp * cy + sr * cp * sy;
      z = cr * cp * sy - sr * sp * cy;
      w = cr * cp * cy + sr * sp * sy;

      this->rot << x, y, z, w;
}